

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_asformat.cpp
# Opt level: O2

UBool __thiscall
icu_63::number::impl::LocalizedNumberFormatterAsFormat::operator==
          (LocalizedNumberFormatterAsFormat *this,Format *other)

{
  UBool UVar1;
  long lVar2;
  UErrorCode localStatus;
  UErrorCode local_a4;
  UnicodeString local_a0;
  UnicodeString local_60;
  
  UVar1 = '\0';
  lVar2 = __dynamic_cast(other,&Format::typeinfo,&typeinfo,0);
  if (lVar2 != 0) {
    local_a4 = U_ZERO_ERROR;
    NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::toSkeleton
              (&local_60,
               &(this->fFormatter).
                super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>,&local_a4);
    NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::toSkeleton
              (&local_a0,
               (NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter> *)(lVar2 + 0x148),
               &local_a4);
    UVar1 = UnicodeString::operator==(&local_60,&local_a0);
    UnicodeString::~UnicodeString(&local_a0);
    UnicodeString::~UnicodeString(&local_60);
  }
  return UVar1;
}

Assistant:

UBool LocalizedNumberFormatterAsFormat::operator==(const Format& other) const {
    auto* _other = dynamic_cast<const LocalizedNumberFormatterAsFormat*>(&other);
    if (_other == nullptr) {
        return false;
    }
    // TODO: Change this to use LocalizedNumberFormatter::operator== if it is ever proposed.
    // This implementation is fine, but not particularly efficient.
    UErrorCode localStatus = U_ZERO_ERROR;
    return fFormatter.toSkeleton(localStatus) == _other->fFormatter.toSkeleton(localStatus);
}